

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

int32 rw::getSizeHAnim(void *object,int32 offset,int32 param_3)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  if ((hAnimDoStream != 0) &&
     (((lVar2 = (long)offset, version < 0x35000 || (*(int *)((long)object + lVar2) != -1)) ||
      (iVar1 = 0, *(long *)((long)object + lVar2 + 8) != 0)))) {
    lVar2 = *(long *)((long)object + lVar2 + 8);
    if (lVar2 == 0) {
      return 0xc;
    }
    iVar1 = *(int *)(lVar2 + 4) * 0xc + 0x14;
  }
  return iVar1;
}

Assistant:

static int32
getSizeHAnim(void *object, int32 offset, int32)
{
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	if(!hAnimDoStream ||
	   (version >= 0x35000 && hanim->id == -1 && hanim->hierarchy == nil))
		return 0;
	if(hanim->hierarchy)
		return 12 + 8 + hanim->hierarchy->numNodes*12;
	return 12;
}